

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_QByteArray>,_char>,_QByteArray>::
~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_QByteArray>,_char>,_QByteArray>
                *this)

{
  QByteArray::~QByteArray((QByteArray *)0x321bc0);
  QStringBuilder<QStringBuilder<QByteArrayView,_QByteArray>,_char>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QByteArrayView,_QByteArray>,_char> *)0x321bca);
  return;
}

Assistant:

~QStringBuilder() = default;